

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O2

void expect_(TestReporter *test_reporter,char *function,char *test_file,int test_line,...)

{
  char in_AL;
  _Bool _Var1;
  int iVar2;
  CgreenVector *pCVar3;
  RecordedExpectation *item;
  int *piVar4;
  int position;
  undefined8 in_R8;
  char *pcVar5;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list constraints;
  __va_list_tag local_f8;
  undefined1 local_d8 [32];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_b8 = in_R8;
  local_b0 = in_R9;
  _Var1 = have_always_expectation_for(function);
  if (_Var1) {
    pcVar5 = 
    "Mocked function [%s] already has an expectation that it will always be called a certain way; any expectations declared after an always expectation are invalid"
    ;
  }
  else {
    _Var1 = have_never_call_expectation_for(function);
    if (!_Var1) {
      local_f8.reg_save_area = local_d8;
      local_f8.overflow_arg_area = &constraints[0].overflow_arg_area;
      local_f8.gp_offset = 0x20;
      local_f8.fp_offset = 0x30;
      pCVar3 = constraints_vector_from_va_list(&local_f8);
      item = create_recorded_expectation(function,test_file,test_line,pCVar3);
      item->time_to_live = 1;
      pCVar3 = item->constraints;
      position = 0;
      do {
        iVar2 = cgreen_vector_size(pCVar3);
        if (iVar2 <= position) {
LAB_0010a4fa:
          cgreen_vector_add(global_expectation_queue,item);
          return;
        }
        piVar4 = (int *)cgreen_vector_get(pCVar3,position);
        if ((piVar4 != (int *)0x0) && (*piVar4 == 8)) {
          item->time_to_live = piVar4[0x12];
          goto LAB_0010a4fa;
        }
        position = position + 1;
      } while( true );
    }
    remove_never_call_expectation_for(function);
    pcVar5 = 
    "Mocked function [%s] already has an expectation that it will never be called; any expectations declared after a never call expectation are invalid"
    ;
  }
  (*test_reporter->assert_true)(test_reporter,test_file,test_line,0,pcVar5,function);
  local_f8.reg_save_area = local_d8;
  local_f8.overflow_arg_area = &constraints[0].overflow_arg_area;
  local_f8.gp_offset = 0x20;
  local_f8.fp_offset = 0x30;
  destroy_constraints(&local_f8);
  return;
}

Assistant:

void expect_(TestReporter* test_reporter, const char *function, const char *test_file, int test_line, ...) {
    va_list constraints;
    RecordedExpectation *expectation;
    CgreenVector *constraints_vector;

    if (have_always_expectation_for(function)) {
        test_reporter->assert_true(
                test_reporter,
                test_file,
                test_line,
                false,
                "Mocked function [%s] already has an expectation that it will always be called a certain way; "
                "any expectations declared after an always expectation are invalid", function);
        va_start(constraints, test_line);
        destroy_constraints(constraints);
        va_end(constraints);

        return;
    }

    if (have_never_call_expectation_for(function)) {
        remove_never_call_expectation_for(function);

        test_reporter->assert_true(
                test_reporter,
                test_file,
                test_line,
                false,
                "Mocked function [%s] already has an expectation that it will never be called; "
                "any expectations declared after a never call expectation are invalid", function);
        va_start(constraints, test_line);
        destroy_constraints(constraints);
        va_end(constraints);

        return;
    }


    va_start(constraints, test_line);
    constraints_vector = constraints_vector_from_va_list(constraints);
    expectation = create_recorded_expectation(function, test_file, test_line, constraints_vector);
    va_end(constraints);

    expectation->time_to_live = 1;
    for (int i = 0 ; i < cgreen_vector_size(expectation->constraints) ; i++) {
        Constraint * constraint = cgreen_vector_get(expectation->constraints, i);
        if (constraint && constraint->type == CGREEN_CALL_COUNTER_CONSTRAINT) {
            expectation->time_to_live = (int)constraint->expected_value.value.integer_value;
            break;
        }
    }
    cgreen_vector_add(global_expectation_queue, expectation);
}